

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_plot.cc
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double z;
  double y;
  double x;
  double r2;
  double r1;
  int i;
  
  for (r1._0_4_ = 0; r1._0_4_ < 200; r1._0_4_ = r1._0_4_ + 1) {
    dVar2 = random_double();
    dVar3 = random_double();
    dVar4 = cos(dVar2 * 6.283185307179586);
    dVar5 = sqrt(dVar3 * (1.0 - dVar3));
    dVar2 = sin(dVar2 * 6.283185307179586);
    dVar6 = sqrt(dVar3 * (1.0 - dVar3));
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,dVar4 * 2.0 * dVar5);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2 * 2.0 * dVar6);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,1.0 - (dVar3 + dVar3));
    std::operator<<(poVar1,'\n');
  }
  return 0;
}

Assistant:

int main() {
    for (int i = 0; i < 200; i++) {
        auto r1 = random_double();
        auto r2 = random_double();
        auto x = std::cos(2*pi*r1) * 2 * std::sqrt(r2*(1-r2));
        auto y = std::sin(2*pi*r1) * 2 * std::sqrt(r2*(1-r2));
        auto z = 1 - 2*r2;
        std::cout << x << " " << y << " " << z << '\n';
    }
}